

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

message * __thiscall booster::log::message::operator=(message *this,message *other)

{
  message *in_RSI;
  message *in_RDI;
  
  if (in_RDI != in_RSI) {
    in_RDI->level_ = in_RSI->level_;
    in_RDI->module_ = in_RSI->module_;
    in_RDI->file_name_ = in_RSI->file_name_;
    in_RDI->file_line_ = in_RSI->file_line_;
    std::
    unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_RSI,
                (unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_RDI);
  }
  return in_RDI;
}

Assistant:

message &message::operator=(message &&other) 
	{
		if(this!=&other) {
			level_ = other.level_;
			module_ = other.module_;
			file_name_=other.file_name_;
			file_line_=other.file_line_;
			message_=std::move(other.message_);
		}
		return *this;
	}